

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O3

QString * qt_punycodeDecoder(QString *__return_storage_ptr__,QString *pc)

{
  char16_t cVar1;
  Data *pDVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  qsizetype qVar8;
  size_type __n;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  char16_t *uc;
  char32_t __c;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QMessageLogger local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(pc->d).size < 0x40) {
    s.m_data = "xn--";
    s.m_size = 4;
    bVar4 = QString::startsWith(pc,s,CaseSensitive);
    if (bVar4) {
      qVar8 = QString::lastIndexOf(pc,(QChar)0x2d,-1,CaseSensitive);
      local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_dataplus._M_p = (pointer)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      iVar10 = (int)qVar8;
      if (iVar10 < 4) {
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0xaaaaaaaa00000000;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        QString::mid((QString *)&local_78,pc,4,(ulong)(iVar10 - 4));
        local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
        local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_construct(&local_58,
                       CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_),
                       L'\0');
        uc = (char16_t *)CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
        if (uc == (char16_t *)0x0) {
          uc = &QString::_empty;
        }
        __n = QString::toUcs4_helper
                        (uc,CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_
                                    ),local_58._M_dataplus._M_p);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::resize(&local_58,__n,L'\0');
        piVar3 = (int *)CONCAT44(local_78.context.line,local_78.context.version);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_78.context.line,local_78.context.version),2,0x10
                      );
          }
        }
      }
      uVar16 = iVar10 + 1;
      uVar7 = (uint)(pc->d).size;
      if (uVar16 < uVar7) {
        __c = L'\x80';
        uVar11 = 0x48;
        uVar15 = 0;
        do {
          uVar13 = (ulong)uVar16;
          uVar16 = uVar16 + 1;
          if (uVar16 < uVar7) {
            uVar16 = uVar7;
          }
          uVar14 = 0x24;
          uVar12 = 1;
          uVar9 = uVar15;
          do {
            cVar1 = (pc->d).ptr[uVar13];
            if ((ushort)cVar1 - 0x30 < 10) {
              uVar5 = (ushort)cVar1 - 0x16;
            }
            else {
              uVar5 = (ushort)cVar1 - 0x41;
              if ((0x19 < uVar5) && (uVar5 = (ushort)cVar1 - 0x61, 0x19 < uVar5)) goto LAB_00263a5f;
            }
            uVar6 = (uint)(uVar5 * uVar12);
            if (((int)(uVar5 * uVar12 >> 0x20) != 0) ||
               (bVar4 = CARRY4(uVar9,uVar6), uVar9 = uVar9 + uVar6, bVar4)) goto LAB_00263a5f;
            uVar6 = uVar14 - uVar11;
            if (uVar11 + 0x1a <= uVar14) {
              uVar6 = 0x1a;
            }
            if (uVar14 <= uVar11) {
              uVar6 = 1;
            }
            if (uVar5 < uVar6) {
              uVar16 = (int)uVar13 + 1;
              break;
            }
            uVar12 = uVar12 * (0x24 - uVar6);
            if ((int)(uVar12 >> 0x20) != 0) goto LAB_00263a5f;
            uVar12 = uVar12 & 0xffffffff;
            uVar13 = uVar13 + 1;
            uVar14 = uVar14 + 0x24;
          } while (uVar13 < uVar7);
          uVar14 = (int)local_58._M_string_length + 1;
          uVar7 = 2;
          if (uVar15 == 0) {
            uVar7 = 700;
          }
          iVar10 = 0;
          uVar13 = (ulong)(uVar9 - uVar15) / (ulong)uVar7;
          uVar7 = (int)(uVar13 / uVar14) + (int)uVar13;
          if (0x1c7 < uVar7) {
            iVar10 = 0;
            uVar15 = uVar7;
            do {
              uVar7 = uVar15 / 0x23;
              iVar10 = iVar10 + 0x24;
              bVar4 = 0x3e57 < uVar15;
              uVar15 = uVar7;
            } while (bVar4);
          }
          bVar4 = CARRY4(__c,uVar9 / uVar14);
          __c = __c + uVar9 / uVar14;
          if (bVar4) {
LAB_00263a5f:
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            goto LAB_00263a6d;
          }
          if ((uint)__c < 0x80) {
            local_78.context.version = 2;
            local_78.context.line = 0;
            local_78.context.file._0_4_ = 0;
            local_78.context.file._4_4_ = 0;
            local_78.context.function._0_4_ = 0;
            local_78.context.function._4_4_ = 0;
            local_78.context.category = "default";
            QMessageLogger::warning
                      (&local_78,"Attempt to insert a basic codepoint. Unhandled overflow?");
            goto LAB_00263a5f;
          }
          if ((0x10ffff < (uint)__c) || ((__c & 0xfffff800U) == 0xd800)) goto LAB_00263a5f;
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::insert
                    (&local_58,(ulong)uVar9 % (ulong)uVar14,1,__c);
          uVar11 = iVar10 + (uVar7 * 0x24 & 0xffff) / (uVar7 + 0x26 & 0xffff);
          uVar15 = (int)((ulong)uVar9 % (ulong)uVar14) + 1;
          uVar7 = (uint)(pc->d).size;
        } while (uVar16 < uVar7);
      }
      QString::fromUcs4(__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_00263a6d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    else {
      pDVar2 = (pc->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (pc->d).ptr;
      (__return_storage_ptr__->d).size = (pc->d).size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00263b51;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00263b51:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Q_AUTOTEST_EXPORT QString qt_punycodeDecoder(const QString &pc)
{
    uint n = initial_n;
    uint i = 0;
    uint bias = initial_bias;

    // Do not try to decode strings longer than allowable for a domain label.
    // Non-ASCII strings are not allowed here anyway, so there is no need
    // to account for surrogates.
    if (pc.size() > MaxDomainLabelLength)
        return QString();

    // strip any ACE prefix
    int start = pc.startsWith("xn--"_L1) ? 4 : 0;
    if (!start)
        return pc;

    // find the last delimiter character '-' in the input array. copy
    // all data before this delimiter directly to the output array.
    int delimiterPos = pc.lastIndexOf(u'-');
    auto output = delimiterPos < 4 ? std::u32string()
                                   : pc.mid(start, delimiterPos - start).toStdU32String();

    // if a delimiter was found, skip to the position after it;
    // otherwise start at the front of the input string. everything
    // before the delimiter is assumed to be basic code points.
    uint cnt = delimiterPos + 1;

    // loop through the rest of the input string, inserting non-basic
    // characters into output as we go.
    while (cnt < (uint) pc.size()) {
        uint oldi = i;
        uint w = 1;

        // find the next index for inserting a non-basic character.
        for (uint k = base; cnt < (uint) pc.size(); k += base) {
            // grab a character from the punycode input and find its
            // delta digit (each digit code is part of the
            // variable-length integer delta)
            uint digit = pc.at(cnt++).unicode();
            if (digit - 48 < 10) digit -= 22;
            else if (digit - 65 < 26) digit -= 65;
            else if (digit - 97 < 26) digit -= 97;
            else digit = base;

            // Fail if the code point has no digit value
            if (digit >= base)
                return QString();

            // i = i + digit * w, fail on overflow
            uint tmp;
            if (qMulOverflow<uint>(digit, w, &tmp) || qAddOverflow<uint>(i, tmp, &i))
                return QString();

            // detect threshold to stop reading delta digits
            uint t;
            if (k <= bias) t = tmin;
            else if (k >= bias + tmax) t = tmax;
            else t = k - bias;

            if (digit < t) break;

            // w = w * (base - t), fail on overflow
            if (qMulOverflow<uint>(w, base - t, &w))
                return QString();
        }

        // find new bias and calculate the next non-basic code
        // character.
        uint outputLength = static_cast<uint>(output.length());
        bias = adapt(i - oldi, outputLength + 1, oldi == 0);

        // n = n + i div (length(output) + 1), fail on overflow
        if (qAddOverflow<uint>(n, i / (outputLength + 1), &n))
            return QString();

        // allow the deltas to wrap around
        i %= (outputLength + 1);

        // if n is a basic code point then fail; this should not happen with
        // correct implementation of Punycode, but check just n case.
        if (n < initial_n) {
            // Don't use Q_ASSERT() to avoid possibility of DoS
            qWarning("Attempt to insert a basic codepoint. Unhandled overflow?");
            return QString();
        }

        // Surrogates should normally be rejected later by other IDNA code.
        // But because of Qt's use of UTF-16 to represent strings the
        // IDNA code is not able to distinguish characters represented as pairs
        // of surrogates from normal code points. This is why surrogates are
        // not allowed here.
        //
        // Allowing surrogates would lead to non-unique (after normalization)
        // encoding of strings with non-BMP characters.
        //
        // Punycode that encodes characters outside the Unicode range is also
        // invalid and is rejected here.
        if (QChar::isSurrogate(n) || n > QChar::LastValidCodePoint)
            return QString();

        // insert the character n at position i
        output.insert(i, 1, static_cast<char32_t>(n));
        ++i;
    }

    return QString::fromStdU32String(output);
}